

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PClass * __thiscall PClass::CreateDerivedClass(PClass *this,FName *name,uint size)

{
  PClassActor *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  PClassActor *oldtype;
  char *pcVar5;
  char *pcVar6;
  PClass *pPVar7;
  PClassActor **ppPVar8;
  uint local_44;
  uint i;
  PClass *existclass;
  size_t bucket;
  PClassActor *pPStack_28;
  bool notnew;
  PClass *type;
  FName *pFStack_18;
  uint size_local;
  FName *name_local;
  PClass *this_local;
  
  pPVar7 = RegistrationInfo.MyClass;
  type._4_4_ = size;
  pFStack_18 = name;
  name_local = (FName *)this;
  if (*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject
                .field_0x24 <= size) {
    iVar3 = FName::operator_cast_to_int(name);
    oldtype = (PClassActor *)
              FTypeTable::FindType(&TypeTable,pPVar7,0,(long)iVar3,(size_t *)&existclass);
    if ((oldtype == (PClassActor *)0x0) ||
       (*(int *)&(oldtype->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.super_DObject.field_0x24 != -1)) {
      bucket._7_1_ = 0;
    }
    else {
      pPStack_28 = oldtype;
      bVar2 = IsDescendantOf(this,(oldtype->super_PClass).ParentClass);
      if (!bVar2) {
        pcVar5 = FName::GetChars(name);
        pcVar6 = FName::GetChars(&(((pPStack_28->super_PClass).ParentClass)->super_PStruct).
                                  super_PNamedType.TypeName);
        I_Error("%s must inherit from %s but doesn\'t.",pcVar5,pcVar6);
      }
      pcVar5 = FName::GetChars(name);
      DPrintf(4,"Defining placeholder class %s\n",pcVar5);
      bucket._7_1_ = 1;
    }
    pPVar7 = (PClass *)GetClass(this);
    pPStack_28 = (PClassActor *)CreateNew(pPVar7);
    FName::operator=(&(pPStack_28->super_PClass).super_PStruct.super_PNamedType.TypeName,name);
    *(uint *)&(pPStack_28->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.super_DObject.field_0x24 = type._4_4_;
    (pPStack_28->super_PClass).bRuntimeClass = true;
    (*(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
      _vptr_DObject[0x16])(this,pPStack_28);
    (*(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
      _vptr_DObject[0x17])(this,pPStack_28);
    if ((bucket._7_1_ & 1) == 0) {
      InsertIntoHash(&pPStack_28->super_PClass);
    }
    else {
      TArray<PClassActor_*,_PClassActor_*>::Pop(&PClassActor::AllActorClasses);
      local_44 = 0;
      while( true ) {
        uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses);
        if (uVar4 <= local_44) break;
        ppPVar8 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)local_44);
        (**(code **)((long)((*ppPVar8)->super_PClass).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_DObject._vptr_DObject + 0xc0))
                  (*ppPVar8,oldtype,pPStack_28);
        ppPVar8 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)local_44);
        pPVar1 = pPStack_28;
        if (*ppPVar8 == oldtype) {
          ppPVar8 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                              (&PClassActor::AllActorClasses,(ulong)local_44);
          *ppPVar8 = pPVar1;
        }
        local_44 = local_44 + 1;
      }
      FTypeTable::ReplaceType(&TypeTable,(PType *)pPStack_28,(PType *)oldtype,(size_t)existclass);
    }
    return &pPStack_28->super_PClass;
  }
  __assert_fail("size >= Size",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xc9f,"PClass *PClass::CreateDerivedClass(FName, unsigned int)");
}

Assistant:

PClass *PClass::CreateDerivedClass(FName name, unsigned int size)
{
	assert (size >= Size);
	PClass *type;
	bool notnew;
	size_t bucket;

	PClass *existclass = static_cast<PClass *>(TypeTable.FindType(RUNTIME_CLASS(PClass), /*FIXME:Outer*/0, name, &bucket));

	// This is a placeholder so fill it in
	if (existclass != NULL && (existclass->Size == TentativeClass))
	{
		type = const_cast<PClass*>(existclass);
		if (!IsDescendantOf(type->ParentClass))
		{
			I_Error("%s must inherit from %s but doesn't.", name.GetChars(), type->ParentClass->TypeName.GetChars());
		}
		DPrintf(DMSG_SPAMMY, "Defining placeholder class %s\n", name.GetChars());
		notnew = true;
	}
	else
	{
		notnew = false;
	}

	// Create a new type object of the same type as us. (We may be a derived class of PClass.)
	type = static_cast<PClass *>(GetClass()->CreateNew());

	type->TypeName = name;
	type->Size = size;
	type->bRuntimeClass = true;
	Derive(type);
	DeriveData(type);
	if (!notnew)
	{
		type->InsertIntoHash();
	}
	else
	{
		PClassActor::AllActorClasses.Pop();	// remove the newly added class from the list
		// todo: replace all affected fields
		for (unsigned i = 0; i < PClassActor::AllActorClasses.Size(); i++)
		{
			PClassActor::AllActorClasses[i]->ReplaceClassRef(existclass, type);
			if (PClassActor::AllActorClasses[i] == existclass)
				PClassActor::AllActorClasses[i] = static_cast<PClassActor*>(type);
		}
		TypeTable.ReplaceType(type, existclass, bucket);
	}
	return type;
}